

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void fits_set_region_components(SAORegion *aRgn)

{
  int iVar1;
  int iVar2;
  RgnShape *pRVar3;
  bool bVar4;
  int local_20;
  int local_1c;
  int icomp;
  int k;
  int j;
  int i;
  SAORegion *aRgn_local;
  
  for (k = 0; k < aRgn->nShapes; k = k + 1) {
    iVar2 = k;
    if (aRgn->Shapes[k].sign == '\0') {
      do {
        iVar1 = iVar2;
        icomp = iVar1 + -1;
        bVar4 = false;
        if (0 < icomp) {
          bVar4 = aRgn->Shapes[icomp].sign == '\0';
        }
        iVar2 = icomp;
      } while (bVar4);
      for (icomp = iVar1 + -2; -1 < icomp; icomp = icomp + -1) {
        if (aRgn->Shapes[icomp].sign != '\0') {
          pRVar3 = (RgnShape *)realloc(aRgn->Shapes,(long)(aRgn->nShapes + 1) * 0xa8);
          aRgn->Shapes = pRVar3;
          aRgn->nShapes = aRgn->nShapes + 1;
          iVar2 = aRgn->nShapes;
          while (local_1c = iVar2 + -1, icomp + 1 < local_1c) {
            memcpy(aRgn->Shapes + local_1c,aRgn->Shapes + (iVar2 + -2),0xa8);
            iVar2 = local_1c;
          }
          k = k + 1;
          memcpy(aRgn->Shapes + (icomp + 1),aRgn->Shapes + k,0xa8);
        }
      }
    }
  }
  local_20 = 0;
  for (k = 0; k < aRgn->nShapes; k = k + 1) {
    if (aRgn->Shapes[k].sign != '\0') {
      local_20 = local_20 + 1;
    }
    aRgn->Shapes[k].comp = local_20;
  }
  return;
}

Assistant:

void fits_set_region_components ( SAORegion *aRgn )
{
/* 
   Internal routine to turn a collection of regions read from an ascii file into
   the more complex structure that is allowed by the FITS REGION extension with
   multiple components. Regions are anded within components and ored between them
   ie for a pixel to be selected it must be selected by at least one component
   and to be selected by a component it must be selected by all that component's
   shapes.

   The algorithm is to replicate every exclude region after every include
   region before it in the list. eg reg1, reg2, -reg3, reg4, -reg5 becomes
   (reg1, -reg3, -reg5), (reg2, -reg5, -reg3), (reg4, -reg5) where the
   parentheses designate components.
*/

  int i, j, k, icomp;

/* loop round shapes */

  i = 0;
  while ( i<aRgn->nShapes ) {

    /* first do the case of an exclude region */

    if ( !aRgn->Shapes[i].sign ) {

      /* we need to run back through the list copying the current shape as
	 required. start by findin the first include shape before this exclude */

      j = i-1;
      while ( j > 0 && !aRgn->Shapes[j].sign ) j--;

      /* then go back one more shape */

      j--;

      /* and loop back through the regions */

      while ( j >= 0 ) {

	/* if this is an include region then insert a copy of the exclude
	   region immediately after it */
           
        /* Note that this makes shallow copies of a polygon's dynamically
        allocated Pts array -- the memory is shared.  This must be checked
        when freeing in fits_free_region. */

	if ( aRgn->Shapes[j].sign ) {

	  aRgn->Shapes = (RgnShape *) realloc (aRgn->Shapes,(1+aRgn->nShapes)*sizeof(RgnShape));
	  aRgn->nShapes++;
	  for (k=aRgn->nShapes-1; k>j+1; k--) aRgn->Shapes[k] = aRgn->Shapes[k-1];

	  i++;
	  aRgn->Shapes[j+1] = aRgn->Shapes[i];

	}

	j--;

      }

    }

    i++;

  }

  /* now set the component numbers */

  icomp = 0;
  for ( i=0; i<aRgn->nShapes; i++ ) {
    if ( aRgn->Shapes[i].sign ) icomp++;
    aRgn->Shapes[i].comp = icomp;

    /*
    printf("i = %d, shape = %d, sign = %d, comp = %d\n", i, aRgn->Shapes[i].shape, aRgn->Shapes[i].sign, aRgn->Shapes[i].comp);
    */

  }

  return;

}